

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  byte bVar1;
  sqlite3_index_constraint_usage *psVar2;
  bool bVar3;
  ulong uVar4;
  char *__dest;
  ulong uVar5;
  uchar *puVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uchar uVar10;
  undefined1 uVar11;
  int iVar12;
  long in_FS_OFFSET;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined1 uStack_40;
  undefined7 local_3f;
  undefined1 uStack_38;
  undefined8 uStack_37;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_38 = 0;
  uStack_37 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  local_3f = 0;
  local_58 = 0;
  uStack_50 = 0;
  uVar4 = (ulong)pIdxInfo->nConstraint;
  if ((long)uVar4 < 1) {
LAB_001f5f52:
    pIdxInfo->idxNum = 2;
    pIdxInfo->needToFreeIdxStr = 1;
    iVar12 = 0;
  }
  else {
    lVar9 = 0;
    bVar3 = false;
    do {
      if ((&pIdxInfo->aConstraint->op)[lVar9] == '@') {
        bVar3 = true;
      }
      lVar9 = lVar9 + 0xc;
    } while (uVar4 * 0xc != lVar9);
    if (pIdxInfo->nConstraint < 1) goto LAB_001f5f52;
    puVar6 = &pIdxInfo->aConstraint->usable;
    uVar5 = 0;
    iVar12 = 0;
    do {
      if (bVar3) {
        if (*puVar6 != '\0') {
LAB_001f5e46:
          uVar8 = ((sqlite3_index_constraint *)(puVar6 + -5))->iColumn;
          if (0 < (int)uVar8) goto LAB_001f5e5f;
LAB_001f5e69:
          if (puVar6[-1] == '@') {
LAB_001f5e73:
            uVar10 = '\x01';
            uVar11 = 0x46;
            goto LAB_001f5ed7;
          }
        }
      }
      else if (*puVar6 != '\0') {
        uVar8 = ((sqlite3_index_constraint *)(puVar6 + -5))->iColumn;
        if ((int)uVar8 < 1) {
          if (puVar6[-1] == '\x02') {
            iVar12 = 0;
            psVar2 = pIdxInfo->aConstraintUsage;
            uVar7 = 0;
            uVar4 = uVar7;
            if (uVar5 != 0) {
              do {
                psVar2[uVar7].argvIndex = 0;
                psVar2[uVar7].omit = '\0';
                uVar7 = uVar7 + 1;
                uVar4 = uVar5;
              } while (uVar5 != uVar7);
            }
            pIdxInfo->idxNum = 1;
            psVar2[uVar5].argvIndex = 1;
            psVar2[uVar4].omit = '\x01';
            pIdxInfo->estimatedCost = 30.0;
            pIdxInfo->estimatedRows = 1;
            pIdxInfo->idxFlags = 1;
            goto LAB_001f5f90;
          }
          goto LAB_001f5e46;
        }
LAB_001f5e5f:
        if ((byte)tab[1].field_0xd < uVar8) goto LAB_001f5e69;
        bVar1 = puVar6[-1];
        if (bVar1 < 0x10) {
          if (bVar1 == 2) {
            uVar11 = 0x41;
          }
          else {
            if (bVar1 != 4) {
              if (bVar1 == 8) {
                uVar10 = '\x01';
                uVar11 = 0x42;
                goto LAB_001f5ed7;
              }
              goto LAB_001f5f06;
            }
            uVar11 = 0x45;
          }
        }
        else {
          if (bVar1 != 0x10) {
            if (bVar1 != 0x20) {
              if (bVar1 != 0x40) goto LAB_001f5f06;
              goto LAB_001f5e73;
            }
            uVar10 = '\x01';
            uVar11 = 0x44;
            goto LAB_001f5ed7;
          }
          uVar11 = 0x43;
        }
        uVar10 = '\0';
LAB_001f5ed7:
        *(undefined1 *)((long)&local_58 + (long)iVar12) = uVar11;
        *(char *)((long)&local_58 + (long)iVar12 + 1) = (char)uVar8 + '/';
        psVar2 = pIdxInfo->aConstraintUsage;
        psVar2[uVar5].argvIndex = (iVar12 - (iVar12 + 2 >> 0x1f)) + 2 >> 1;
        psVar2[uVar5].omit = uVar10;
        iVar12 = iVar12 + 2;
      }
LAB_001f5f06:
      uVar5 = uVar5 + 1;
    } while ((uVar5 < uVar4) && (puVar6 = puVar6 + 0xc, iVar12 < 0x28));
    pIdxInfo->idxNum = 2;
    pIdxInfo->needToFreeIdxStr = 1;
    if (0 < iVar12) {
      __dest = (char *)sqlite3_malloc(iVar12 + 1U);
      pIdxInfo->idxStr = __dest;
      if (__dest == (char *)0x0) {
        iVar12 = 7;
        goto LAB_001f5f90;
      }
      memcpy(__dest,&local_58,(ulong)(iVar12 + 1U));
    }
  }
  lVar9 = *(long *)&tab[3].nRef >> ((byte)((uint)(iVar12 - (iVar12 >> 0x1f)) >> 1) & 0x3f);
  pIdxInfo->estimatedCost = (double)lVar9 * 6.0;
  pIdxInfo->estimatedRows = lVar9;
  iVar12 = 0;
LAB_001f5f90:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar12;
}

Assistant:

static int rtreeBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  Rtree *pRtree = (Rtree*)tab;
  int rc = SQLITE_OK;
  int ii;
  int bMatch = 0;                 /* True if there exists a MATCH constraint */
  i64 nRow;                       /* Estimated rows returned by this scan */

  int iIdx = 0;
  char zIdxStr[RTREE_MAX_DIMENSIONS*8+1];
  memset(zIdxStr, 0, sizeof(zIdxStr));

  /* Check if there exists a MATCH constraint - even an unusable one. If there
  ** is, do not consider the lookup-by-rowid plan as using such a plan would
  ** require the VDBE to evaluate the MATCH constraint, which is not currently
  ** possible. */
  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    if( pIdxInfo->aConstraint[ii].op==SQLITE_INDEX_CONSTRAINT_MATCH ){
      bMatch = 1;
    }
  }

  assert( pIdxInfo->idxStr==0 );
  for(ii=0; ii<pIdxInfo->nConstraint && iIdx<(int)(sizeof(zIdxStr)-1); ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];

    if( bMatch==0 && p->usable
     && p->iColumn<=0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ
    ){
      /* We have an equality constraint on the rowid. Use strategy 1. */
      int jj;
      for(jj=0; jj<ii; jj++){
        pIdxInfo->aConstraintUsage[jj].argvIndex = 0;
        pIdxInfo->aConstraintUsage[jj].omit = 0;
      }
      pIdxInfo->idxNum = 1;
      pIdxInfo->aConstraintUsage[ii].argvIndex = 1;
      pIdxInfo->aConstraintUsage[jj].omit = 1;

      /* This strategy involves a two rowid lookups on an B-Tree structures
      ** and then a linear search of an R-Tree node. This should be
      ** considered almost as quick as a direct rowid lookup (for which
      ** sqlite uses an internal cost of 0.0). It is expected to return
      ** a single row.
      */
      pIdxInfo->estimatedCost = 30.0;
      pIdxInfo->estimatedRows = 1;
      pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
      return SQLITE_OK;
    }

    if( p->usable
    && ((p->iColumn>0 && p->iColumn<=pRtree->nDim2)
        || p->op==SQLITE_INDEX_CONSTRAINT_MATCH)
    ){
      u8 op;
      u8 doOmit = 1;
      switch( p->op ){
        case SQLITE_INDEX_CONSTRAINT_EQ:    op = RTREE_EQ;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_GT:    op = RTREE_GT;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_LE:    op = RTREE_LE;    break;
        case SQLITE_INDEX_CONSTRAINT_LT:    op = RTREE_LT;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_GE:    op = RTREE_GE;    break;
        case SQLITE_INDEX_CONSTRAINT_MATCH: op = RTREE_MATCH; break;
        default:                            op = 0;           break;
      }
      if( op ){
        zIdxStr[iIdx++] = op;
        zIdxStr[iIdx++] = (char)(p->iColumn - 1 + '0');
        pIdxInfo->aConstraintUsage[ii].argvIndex = (iIdx/2);
        pIdxInfo->aConstraintUsage[ii].omit = doOmit;
      }
    }
  }

  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  if( iIdx>0 ){
    pIdxInfo->idxStr = sqlite3_malloc( iIdx+1 );
    if( pIdxInfo->idxStr==0 ){
      return SQLITE_NOMEM;
    }
    memcpy(pIdxInfo->idxStr, zIdxStr, iIdx+1);
  }

  nRow = pRtree->nRowEst >> (iIdx/2);
  pIdxInfo->estimatedCost = (double)6.0 * (double)nRow;
  pIdxInfo->estimatedRows = nRow;

  return rc;
}